

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_xor_signed_Test::TestBody(correctness_xor_signed_Test *this)

{
  bool bVar1;
  char *in_R9;
  big_integer bStack_1e8;
  big_integer local_1b0;
  big_integer local_178;
  AssertionResult gtest_ar_;
  big_integer local_130;
  big_integer local_f8;
  big_integer local_c0;
  big_integer b;
  big_integer a;
  
  big_integer::big_integer(&a,0xaa);
  big_integer::big_integer(&b,0xcc);
  big_integer::big_integer(&local_c0,&a);
  big_integer::big_integer(&local_f8,&b);
  big_integer::big_integer(&bStack_1e8,0x100);
  operator-(&local_1b0,&local_f8,&bStack_1e8);
  operator^(&local_178,&local_c0,&local_1b0);
  big_integer::big_integer(&local_130,-0x9a);
  bVar1 = operator==(&local_178,&local_130);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = bVar1;
  big_integer::~big_integer(&local_130);
  big_integer::~big_integer(&local_178);
  big_integer::~big_integer(&local_1b0);
  big_integer::~big_integer(&bStack_1e8);
  big_integer::~big_integer(&local_f8);
  big_integer::~big_integer(&local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_178,(internal *)&gtest_ar_,
               (AssertionResult *)"(a ^ (b - 256)) == (0x66 - 256)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bStack_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x180,(char *)local_178._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bStack_1e8,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bStack_1e8);
    std::__cxx11::string::~string((string *)&local_178);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  big_integer::~big_integer(&b);
  big_integer::~big_integer(&a);
  return;
}

Assistant:

TEST(correctness, xor_signed)
{
    big_integer a = 0xaa;
    big_integer b = 0xcc;

    EXPECT_TRUE((a ^ (b - 256)) == (0x66 - 256));
}